

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O1

Gia_Man_t *
Gia_ManDupFromVecs(Gia_Man_t *p,Vec_Int_t *vCis,Vec_Int_t *vAnds,Vec_Int_t *vCos,int nRegs)

{
  int iVar1;
  char *pcVar2;
  Gia_Obj_t *pGVar3;
  ulong uVar4;
  Gia_Obj_t *pGVar5;
  uint uVar6;
  Gia_Man_t *p_00;
  size_t sVar7;
  char *pcVar8;
  Gia_Obj_t *pGVar9;
  long lVar10;
  
  p_00 = Gia_ManStart(5000);
  pcVar2 = p->pName;
  if (pcVar2 == (char *)0x0) {
    pcVar8 = (char *)0x0;
  }
  else {
    sVar7 = strlen(pcVar2);
    pcVar8 = (char *)malloc(sVar7 + 1);
    strcpy(pcVar8,pcVar2);
  }
  p_00->pName = pcVar8;
  pcVar2 = p->pSpec;
  if (pcVar2 == (char *)0x0) {
    pcVar8 = (char *)0x0;
  }
  else {
    sVar7 = strlen(pcVar2);
    pcVar8 = (char *)malloc(sVar7 + 1);
    strcpy(pcVar8,pcVar2);
  }
  p_00->pSpec = pcVar8;
  p->pObjs->Value = 0;
  if (0 < vCis->nSize) {
    lVar10 = 0;
    do {
      iVar1 = vCis->pArray[lVar10];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_006b10b5;
      pGVar3 = p->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      pGVar9 = Gia_ManAppendObj(p_00);
      uVar4 = *(ulong *)pGVar9;
      *(ulong *)pGVar9 = uVar4 | 0x9fffffff;
      *(ulong *)pGVar9 =
           uVar4 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20
      ;
      pGVar5 = p_00->pObjs;
      if ((pGVar9 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar9)) {
LAB_006b10d4:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar9 - (long)pGVar5) >> 2) * -0x55555555);
      pGVar5 = p_00->pObjs;
      if ((pGVar9 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar9)) goto LAB_006b10d4;
      pGVar3[iVar1].Value = (int)((ulong)((long)pGVar9 - (long)pGVar5) >> 2) * 0x55555556;
      lVar10 = lVar10 + 1;
    } while (lVar10 < vCis->nSize);
  }
  if (0 < vAnds->nSize) {
    lVar10 = 0;
    do {
      iVar1 = vAnds->pArray[lVar10];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_006b10b5;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar3 = p->pObjs + iVar1;
      uVar4 = *(ulong *)pGVar3;
      if (((int)pGVar3[-(ulong)((uint)uVar4 & 0x1fffffff)].Value < 0) ||
         (uVar6 = (uint)(uVar4 >> 0x20), (int)pGVar3[-(ulong)(uVar6 & 0x1fffffff)].Value < 0))
      goto LAB_006b10f3;
      uVar6 = Gia_ManAppendAnd(p_00,(uint)(uVar4 >> 0x1d) & 1 ^
                                    pGVar3[-(ulong)((uint)uVar4 & 0x1fffffff)].Value,
                               pGVar3[-(ulong)(uVar6 & 0x1fffffff)].Value ^ uVar6 >> 0x1d & 1);
      pGVar3->Value = uVar6;
      lVar10 = lVar10 + 1;
    } while (lVar10 < vAnds->nSize);
  }
  if (0 < vCos->nSize) {
    lVar10 = 0;
    do {
      iVar1 = vCos->pArray[lVar10];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) {
LAB_006b10b5:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar3 = p->pObjs + iVar1;
      if ((int)pGVar3[-(ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff)].Value < 0) {
LAB_006b10f3:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                      ,0xf5,"int Abc_LitNotCond(int, int)");
      }
      uVar6 = Gia_ManAppendCo(p_00,(uint)*(undefined8 *)pGVar3 >> 0x1d & 1 ^
                                   pGVar3[-(ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff)].Value)
      ;
      pGVar3->Value = uVar6;
      lVar10 = lVar10 + 1;
    } while (lVar10 < vCos->nSize);
  }
  Gia_ManSetRegNum(p_00,nRegs);
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDupFromVecs( Gia_Man_t * p, Vec_Int_t * vCis, Vec_Int_t * vAnds, Vec_Int_t * vCos, int nRegs )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    // start the new manager
    pNew = Gia_ManStart( 5000 );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    // create constant
    Gia_ManConst0(p)->Value = 0;
    // create PIs
    Gia_ManForEachObjVec( vCis, p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    // create internal nodes
    Gia_ManForEachObjVec( vAnds, p, pObj, i )
        pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    // create ROs
    Gia_ManForEachObjVec( vCos, p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManSetRegNum( pNew, nRegs );
    return pNew;
}